

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O0

bool __thiscall Security::EncodeOpnd(Security *this,Instr *instr,Opnd *opnd)

{
  StackSym *pSVar1;
  OpndKind OVar2;
  AddrOpndKind addrOpndKind;
  bool bVar3;
  IRType type;
  int32 iVar4;
  int32 iVar5;
  AddrOpnd *this_00;
  Var address;
  IndirOpnd *this_01;
  RegOpnd *pRVar6;
  IndirOpnd *src;
  IntConstOpnd *pIVar7;
  long lVar8;
  IntConstType IVar9;
  RegOpnd *pRVar10;
  Opnd *pOVar11;
  int srcNum;
  StackSym *dstSym;
  RegOpnd *dstRegOpnd;
  Opnd *dst;
  RegOpnd *newBaseOpnd;
  IntConstOpnd *indexOpnd;
  int32 diff;
  IndirOpnd *indir;
  IndirOpnd *indirOpnd;
  AddrOpnd *addrOpnd;
  IntConstOpnd *intConstOpnd;
  anon_class_24_3_ed9ba0f8 unlinkSrc;
  RegOpnd *pRStack_30;
  bool isSrc2;
  RegOpnd *newOpnd;
  Opnd *opnd_local;
  Instr *instr_local;
  Security *this_local;
  
  unlinkSrc.isSrc2._7_1_ = 0;
  intConstOpnd = (IntConstOpnd *)&newOpnd;
  unlinkSrc.opnd = &opnd_local;
  unlinkSrc.instr = (Instr **)((long)&unlinkSrc.isSrc2 + 7);
  newOpnd = (RegOpnd *)opnd;
  opnd_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  OVar2 = IR::Opnd::GetKind(opnd);
  if (OVar2 == OpndKindIntConst) {
    pIVar7 = IR::Opnd::AsIntConstOpnd(&newOpnd->super_Opnd);
    EncodeOpnd::anon_class_24_3_ed9ba0f8::operator()((anon_class_24_3_ed9ba0f8 *)&intConstOpnd);
    pOVar11 = opnd_local;
    lVar8 = IR::EncodableOpnd<long>::GetValue(&pIVar7->super_EncodableOpnd<long>);
    IVar9 = EncodeValue(this,(Instr *)pOVar11,&pIVar7->super_Opnd,lVar8,&stack0xffffffffffffffd0);
    IR::EncodableOpnd<long>::SetEncodedValue(&pIVar7->super_EncodableOpnd<long>,IVar9);
LAB_00843a8d:
    pOVar11 = IR::Instr::GetDst((Instr *)opnd_local);
    if (pOVar11 != (Opnd *)0x0) {
      type = IR::Opnd::GetType(pOVar11);
      pRStack_30 = (RegOpnd *)
                   IR::Opnd::UseWithNewType
                             (&pRStack_30->super_Opnd,type,(Func *)opnd_local[2]._vptr_Opnd);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar11);
      if (bVar3) {
        pRVar6 = IR::Opnd::AsRegOpnd(pOVar11);
        pSVar1 = pRVar6->m_sym;
        if (pSVar1 != (StackSym *)0x0) {
          *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xfffffff7;
          *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xffffffef;
          *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xffffff7f;
          *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xffffffdf;
          *(uint *)&pSVar1->field_0x18 = *(uint *)&pSVar1->field_0x18 & 0xfffffeff;
        }
      }
    }
    srcNum = 1;
    if ((unlinkSrc.isSrc2._7_1_ & 1) != 0) {
      srcNum = 2;
    }
    LowererMD::ImmedSrcToReg((Instr *)opnd_local,&pRStack_30->super_Opnd,srcNum);
    return true;
  }
  if (OVar2 == OpndKindAddr) {
    this_00 = IR::Opnd::AsAddrOpnd(&newOpnd->super_Opnd);
    EncodeOpnd::anon_class_24_3_ed9ba0f8::operator()((anon_class_24_3_ed9ba0f8 *)&intConstOpnd);
    address = (Var)EncodeValue(this,(Instr *)opnd_local,&this_00->super_Opnd,
                               (IntConstType)this_00->m_address,&stack0xffffffffffffffd0);
    addrOpndKind = IR::AddrOpnd::GetAddrOpndKind(this_00);
    IR::AddrOpnd::SetEncodedValue(this_00,address,addrOpndKind);
    goto LAB_00843a8d;
  }
  if (OVar2 != OpndKindIndir) {
    return false;
  }
  this_01 = IR::Opnd::AsIndirOpnd(&newOpnd->super_Opnd);
  pRVar6 = IR::IndirOpnd::GetBaseOpnd(this_01);
  if ((pRVar6 == (RegOpnd *)0x0) ||
     (pRVar6 = IR::IndirOpnd::GetIndexOpnd(this_01), pRVar6 != (RegOpnd *)0x0)) {
LAB_00843952:
    iVar4 = IR::IndirOpnd::GetOffset(this_01);
    pIVar7 = IR::IntConstOpnd::New((long)iVar4,TyInt64,(Func *)opnd_local[2]._vptr_Opnd,false);
    pOVar11 = opnd_local;
    lVar8 = IR::EncodableOpnd<long>::GetValue(&pIVar7->super_EncodableOpnd<long>);
    IVar9 = EncodeValue(this,(Instr *)pOVar11,&pIVar7->super_Opnd,lVar8,&stack0xffffffffffffffd0);
    IR::IntConstOpnd::SetValue(pIVar7,IVar9);
    IR::IndirOpnd::SetOffset(this_01,0,false);
    pRVar6 = IR::IndirOpnd::GetIndexOpnd(this_01);
    if (pRVar6 == (RegOpnd *)0x0) {
      IR::IndirOpnd::SetIndexOpnd(this_01,pRStack_30);
    }
    else {
      pRVar6 = IR::IndirOpnd::GetBaseOpnd(this_01);
      if (pRVar6 == (RegOpnd *)0x0) {
        IR::IndirOpnd::SetBaseOpnd(this_01,pRStack_30);
      }
      else {
        pRVar6 = IR::RegOpnd::New(TyInt64,(Func *)opnd_local[2]._vptr_Opnd);
        pRVar10 = IR::IndirOpnd::GetBaseOpnd(this_01);
        Lowerer::InsertAdd(false,&pRVar6->super_Opnd,&pRStack_30->super_Opnd,&pRVar10->super_Opnd,
                           (Instr *)opnd_local);
        IR::IndirOpnd::ReplaceBaseOpnd(this_01,pRVar6);
      }
    }
    return true;
  }
  iVar4 = IR::IndirOpnd::GetOffset(this_01);
  bVar3 = Math::FitsInWord(iVar4);
  if (!bVar3) goto LAB_00843952;
  if (this->baseOpnd != (RegOpnd *)0x0) {
    pRVar6 = this->baseOpnd;
    pRVar10 = IR::IndirOpnd::GetBaseOpnd(this_01);
    bVar3 = IR::Opnd::IsEqual(&pRVar6->super_Opnd,&pRVar10->super_Opnd);
    if (bVar3) goto LAB_008438f9;
  }
  if (this->cookieOpnd != (IntConstOpnd *)0x0) {
    IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
  }
  pIVar7 = BuildCookieOpnd(TyInt16,(Func *)opnd_local[2]._vptr_Opnd);
  this->cookieOpnd = pIVar7;
  pRVar6 = IR::RegOpnd::New(TyInt64,(Func *)opnd_local[2]._vptr_Opnd);
  this->basePlusCookieOpnd = pRVar6;
  pRVar6 = IR::IndirOpnd::GetBaseOpnd(this_01);
  this->baseOpnd = pRVar6;
  pRVar6 = this->baseOpnd;
  iVar4 = IR::IntConstOpnd::AsInt32(this->cookieOpnd);
  src = IR::IndirOpnd::New(pRVar6,iVar4,TyInt64,(Func *)opnd_local[2]._vptr_Opnd,false);
  Lowerer::InsertLea(this->basePlusCookieOpnd,&src->super_Opnd,(Instr *)opnd_local);
LAB_008438f9:
  iVar4 = IR::IndirOpnd::GetOffset(this_01);
  iVar5 = IR::IntConstOpnd::AsInt32(this->cookieOpnd);
  IR::IndirOpnd::SetOffset(this_01,iVar4 - iVar5,false);
  IR::IndirOpnd::SetBaseOpnd(this_01,this->basePlusCookieOpnd);
  return true;
}

Assistant:

bool
Security::EncodeOpnd(IR::Instr * instr, IR::Opnd *opnd)
{
    IR::RegOpnd *newOpnd;
    bool isSrc2 = false;

    const auto unlinkSrc = [&]() {
        if (opnd != instr->GetSrc1())
        {
            Assert(opnd == instr->GetSrc2());
            isSrc2 = true;
            instr->UnlinkSrc2();
        }
        else
        {
            instr->UnlinkSrc1();
        }
    };

    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();

        unlinkSrc();

        intConstOpnd->SetEncodedValue(EncodeValue(instr, intConstOpnd, intConstOpnd->GetValue(), &newOpnd));
    }
    break;

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();

        unlinkSrc();

        addrOpnd->SetEncodedValue((Js::Var)this->EncodeValue(instr, addrOpnd, (IntConstType)addrOpnd->m_address, &newOpnd), addrOpnd->GetAddrOpndKind());
    }
    break;

    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();

        // Using 32 bit cookie causes major perf loss on the subsequent indirs, so only support this path for 16 bit offset
        // It's relatively rare for base to be null or to have index + offset, so fall back to the more generic xor method for these
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetIndexOpnd() == nullptr && Math::FitsInWord(indirOpnd->GetOffset()))
        {
            if (!this->baseOpnd || !this->baseOpnd->IsEqual(indirOpnd->GetBaseOpnd()))
            {
                if (this->cookieOpnd != nullptr)
                {
                    this->cookieOpnd->Free(this->func);
                }
                this->cookieOpnd = BuildCookieOpnd(TyInt16, instr->m_func);
                this->basePlusCookieOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
                this->baseOpnd = indirOpnd->GetBaseOpnd();
                IR::IndirOpnd * indir = IR::IndirOpnd::New(this->baseOpnd, this->cookieOpnd->AsInt32(), TyMachReg, instr->m_func);
                Lowerer::InsertLea(this->basePlusCookieOpnd, indir, instr);
            }
            int32 diff = indirOpnd->GetOffset() - this->cookieOpnd->AsInt32();
            indirOpnd->SetOffset((int32)diff);
            indirOpnd->SetBaseOpnd(this->basePlusCookieOpnd);
            return true;
        }

        IR::IntConstOpnd *indexOpnd = IR::IntConstOpnd::New(indirOpnd->GetOffset(), TyMachReg, instr->m_func);

        indexOpnd->SetValue(EncodeValue(instr, indexOpnd, indexOpnd->GetValue(), &newOpnd));

        indirOpnd->SetOffset(0);
        if (indirOpnd->GetIndexOpnd() != nullptr)
        {
            // update the base rather than the index, because index might have scale
            if (indirOpnd->GetBaseOpnd() != nullptr)
            {
                IR::RegOpnd * newBaseOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
                Lowerer::InsertAdd(false, newBaseOpnd, newOpnd, indirOpnd->GetBaseOpnd(), instr);
                indirOpnd->ReplaceBaseOpnd(newBaseOpnd);
            }
            else
            {
                indirOpnd->SetBaseOpnd(newOpnd);
            }
        }
        else
        {
            indirOpnd->SetIndexOpnd(newOpnd);
        }
    }
    return true;

    default:
        return false;
    }

    IR::Opnd *dst = instr->GetDst();

    if (dst)
    {
#if TARGET_64
        // Ensure the left and right operand has the same type (that might not be true for constants on x64)
        newOpnd = (IR::RegOpnd *)newOpnd->UseWithNewType(dst->GetType(), instr->m_func);
#endif
        if (dst->IsRegOpnd())
        {
            IR::RegOpnd *dstRegOpnd = dst->AsRegOpnd();
            StackSym *dstSym = dstRegOpnd->m_sym;

            if (dstSym)
            {
                dstSym->m_isConst = false;
                dstSym->m_isIntConst = false;
                dstSym->m_isInt64Const = false;
                dstSym->m_isTaggableIntConst = false;
                dstSym->m_isFltConst = false;
            }
        }
    }

    LowererMD::ImmedSrcToReg(instr, newOpnd, isSrc2 ? 2 : 1);
    return true;
}